

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_type.cpp
# Opt level: O2

bool duckdb::MetricsUtils::IsPhaseTimingMetric(MetricsType type)

{
  return (type & ~CUMULATIVE_ROWS_SCANNED) == ALL_OPTIMIZERS;
}

Assistant:

bool MetricsUtils::IsPhaseTimingMetric(MetricsType type) {
    switch(type) {
        case MetricsType::ALL_OPTIMIZERS:
        case MetricsType::CUMULATIVE_OPTIMIZER_TIMING:
        case MetricsType::PLANNER:
        case MetricsType::PLANNER_BINDING:
        case MetricsType::PHYSICAL_PLANNER:
        case MetricsType::PHYSICAL_PLANNER_COLUMN_BINDING:
        case MetricsType::PHYSICAL_PLANNER_RESOLVE_TYPES:
        case MetricsType::PHYSICAL_PLANNER_CREATE_PLAN:
            return true;
        default:
            return false;
    };
}